

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest11InhibitPolicyMapping_::
Section11ValidinhibitPolicyMappingTest2<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::~Section11ValidinhibitPolicyMappingTest2
          (Section11ValidinhibitPolicyMappingTest2<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  Section11ValidinhibitPolicyMappingTest2<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
  *this_local;
  
  ~Section11ValidinhibitPolicyMappingTest2(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest11InhibitPolicyMapping,
                     Section11ValidinhibitPolicyMappingTest2) {
  const char* const certs[] = {
      "TrustAnchorRootCertificate", "inhibitPolicyMapping1P12CACert",
      "inhibitPolicyMapping1P12subCACert", "ValidinhibitPolicyMappingTest2EE"};
  const char* const crls[] = {"TrustAnchorRootCRL",
                              "inhibitPolicyMapping1P12CACRL",
                              "inhibitPolicyMapping1P12subCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.11.2";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}